

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-customop.c
# Opt level: O0

void custom1(ggml_tensor *dst,ggml_tensor *a,int ith,int nth,void *userdata)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  int i;
  int ie1;
  int ie0;
  int dr;
  int ne;
  float *dst_data;
  float *a_data;
  int local_50;
  int local_4c;
  
  if (in_R8 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x26,"GGML_ASSERT(%s) failed","userdata == NULL");
  }
  uVar2 = ggml_are_same_shape(in_RDI,in_RSI);
  if ((uVar2 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x27,"GGML_ASSERT(%s) failed","ggml_are_same_shape(dst, a)");
  }
  LOCK();
  g_custom1_count = g_custom1_count + 1;
  UNLOCK();
  lVar3 = ggml_get_data_f32(in_RSI);
  lVar4 = ggml_get_data_f32(in_RDI);
  uVar2 = ggml_is_contiguous(in_RDI);
  if ((uVar2 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x2f,"GGML_ASSERT(%s) failed","ggml_is_contiguous(dst)");
  }
  uVar2 = ggml_is_contiguous(in_RSI);
  if ((uVar2 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x30,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  local_50 = ggml_nelements(in_RDI);
  iVar1 = (local_50 + in_ECX + -1) / in_ECX;
  local_4c = iVar1 * in_EDX;
  if (local_4c + iVar1 < local_50) {
    local_50 = local_4c + iVar1;
  }
  for (; local_4c < local_50; local_4c = local_4c + 1) {
    *(float *)(lVar4 + (long)local_4c * 4) = *(float *)(lVar3 + (long)local_4c * 4) * 2.0;
  }
  return;
}

Assistant:

void custom1(struct ggml_tensor * dst , const struct ggml_tensor * a, int ith, int nth, void * userdata) {
    // check that the userdata is correct
    GGML_ASSERT(userdata == NULL);
    GGML_ASSERT(ggml_are_same_shape(dst, a));

    atomic_fetch_add(&g_custom1_count, 1);

    const float * a_data = ggml_get_data_f32(a);
    float * dst_data = ggml_get_data_f32(dst);

    // this assumes that the tensors are contiguous
    GGML_ASSERT(ggml_is_contiguous(dst));
    GGML_ASSERT(ggml_is_contiguous(a));

    // parallelize by elements
    const int ne = (int)ggml_nelements(dst);
    const int dr = (ne + nth - 1) / nth;
    const int ie0 = dr * ith;
    const int ie1 = MIN(ie0 + dr, ne);

    for (int i = ie0; i < ie1; ++i) {
        dst_data[i] = a_data[i] * 2;
    }
}